

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc3::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc3 *this,EvalContext *ctx,Interval *xi,
          Interval *yi,Interval *zi)

{
  EvalContext *pEVar1;
  byte bVar2;
  byte bVar3;
  deRoundingMode dVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  byte local_118 [8];
  double local_110;
  double dStack_108;
  byte local_f9;
  Interval *local_f8;
  EvalContext *local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  Interval local_48;
  
  local_48.m_hasNaN = false;
  dVar9 = INFINITY;
  dVar11 = -INFINITY;
  local_48.m_lo = INFINITY;
  local_48.m_hi = -INFINITY;
  local_d8 = xi->m_lo;
  if (local_d8 < xi->m_hi || local_d8 == xi->m_hi) {
    dVar9 = yi->m_lo;
    local_f0 = ctx;
    if (dVar9 < yi->m_hi || dVar9 == yi->m_hi) {
      dVar11 = zi->m_lo;
      if (dVar11 < zi->m_hi || dVar11 == zi->m_hi) {
        local_e8 = dVar9;
        local_b8 = dVar11;
        dVar4 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_b8,local_118,this,ctx);
        local_f8 = (Interval *)CONCAT71(local_f8._1_7_,local_118[0]);
        local_c8 = local_110;
        dStack_c0 = dStack_108;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_b8,local_118,this,ctx);
        local_a8 = (double)CONCAT71(local_a8._1_7_,local_118[0]);
        local_78 = local_110;
        dStack_70 = dStack_108;
        deSetRoundingMode(dVar4);
        local_b8 = zi->m_hi;
        dVar4 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_b8,local_118,this,ctx);
        local_98 = (double)CONCAT71(local_98._1_7_,local_118[0]);
        local_88 = local_110;
        dStack_80 = dStack_108;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_b8,local_118,this,ctx);
        bVar3 = local_118[0];
        local_e8 = local_110;
        dStack_e0 = dStack_108;
        deSetRoundingMode(dVar4);
        dVar9 = (double)(~-(ulong)(local_c8 <= local_78) & (ulong)local_78 |
                        (ulong)local_c8 & -(ulong)(local_c8 <= local_78));
        dVar11 = (double)(~-(ulong)(dStack_70 <= dStack_c0) & (ulong)dStack_70 |
                         (ulong)dStack_c0 & -(ulong)(dStack_70 <= dStack_c0));
        if (((ulong)local_98 & 1) != 0) {
          bVar3 = 1;
        }
        if ((((byte)local_f8 | local_a8._0_1_) & 1) != 0) {
          bVar3 = 1;
        }
        dVar8 = (double)(~-(ulong)(local_88 <= local_e8) & (ulong)local_e8 |
                        (ulong)local_88 & -(ulong)(local_88 <= local_e8));
        dVar10 = (double)(~-(ulong)(dStack_e0 <= dStack_80) & (ulong)dStack_e0 |
                         (ulong)dStack_80 & -(ulong)(dStack_e0 <= dStack_80));
        uVar6 = -(ulong)(dVar9 <= dVar8);
        uVar7 = -(ulong)(dVar10 <= dVar11);
        dVar9 = (double)(~uVar6 & (ulong)dVar8 | (ulong)dVar9 & uVar6);
        dVar11 = (double)(~uVar7 & (ulong)dVar10 | (ulong)dVar11 & uVar7);
      }
      else {
        dVar9 = INFINITY;
        dVar11 = -INFINITY;
        bVar3 = 0;
      }
      bVar5 = zi->m_hasNaN;
      if ((bool)bVar5 == true) {
        dVar9 = (double)((ulong)dVar9 & -(ulong)(dVar9 <= INFINITY) |
                        ~-(ulong)(dVar9 <= INFINITY) & 0x7ff0000000000000);
        dVar11 = (double)((ulong)dVar11 & -(ulong)(-INFINITY <= dVar11) |
                         ~-(ulong)(-INFINITY <= dVar11) & 0xfff0000000000000);
        bVar3 = 1;
      }
      dVar8 = zi->m_lo;
      if (dVar8 < zi->m_hi || dVar8 == zi->m_hi) {
        local_e8 = yi->m_hi;
        local_c8 = dVar9;
        dStack_c0 = dVar11;
        local_b8 = dVar8;
        dVar4 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_b8,local_118,this,local_f0);
        local_a8 = (double)CONCAT71(local_a8._1_7_,local_118[0]);
        local_78 = local_110;
        dStack_70 = dStack_108;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_b8,local_118,this,local_f0);
        local_88 = (double)CONCAT71(local_88._1_7_,local_118[0]);
        local_98 = local_110;
        dStack_90 = dStack_108;
        deSetRoundingMode(dVar4);
        local_b8 = zi->m_hi;
        dVar4 = deGetRoundingMode();
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_b8,local_118,this,local_f0);
        local_68 = (double)CONCAT71(local_68._1_7_,local_118[0]);
        local_58 = local_110;
        dStack_50 = dStack_108;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        local_f8 = __return_storage_ptr__;
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_b8,local_118,this,local_f0);
        bVar2 = local_118[0];
        local_d8 = local_110;
        dStack_d0 = dStack_108;
        deSetRoundingMode(dVar4);
        dVar9 = (double)(~-(ulong)(local_78 <= local_98) & (ulong)local_98 |
                        (ulong)local_78 & -(ulong)(local_78 <= local_98));
        dVar11 = (double)(~-(ulong)(dStack_90 <= dStack_70) & (ulong)dStack_90 |
                         (ulong)dStack_70 & -(ulong)(dStack_90 <= dStack_70));
        if (((ulong)local_68 & 1) != 0) {
          bVar2 = 1;
        }
        if (((local_a8._0_1_ | local_88._0_1_) & 1) != 0) {
          bVar2 = 1;
        }
        dVar8 = (double)(~-(ulong)(local_58 <= local_d8) & (ulong)local_d8 |
                        (ulong)local_58 & -(ulong)(local_58 <= local_d8));
        dVar10 = (double)(~-(ulong)(dStack_d0 <= dStack_50) & (ulong)dStack_d0 |
                         (ulong)dStack_50 & -(ulong)(dStack_d0 <= dStack_50));
        uVar6 = -(ulong)(dVar9 <= dVar8);
        uVar7 = -(ulong)(dVar10 <= dVar11);
        dVar8 = (double)(~uVar6 & (ulong)dVar8 | (ulong)dVar9 & uVar6);
        dVar10 = (double)(~uVar7 & (ulong)dVar10 | (ulong)dVar11 & uVar7);
        bVar5 = zi->m_hasNaN;
        __return_storage_ptr__ = local_f8;
        dVar9 = local_c8;
        dVar11 = dStack_c0;
      }
      else {
        dVar8 = INFINITY;
        dVar10 = -INFINITY;
        bVar2 = 0;
      }
      if ((bVar5 & 1) != 0) {
        dVar8 = (double)((ulong)dVar8 & -(ulong)(dVar8 <= INFINITY) |
                        ~-(ulong)(dVar8 <= INFINITY) & 0x7ff0000000000000);
        dVar10 = (double)((ulong)dVar10 & -(ulong)(-INFINITY <= dVar10) |
                         ~-(ulong)(-INFINITY <= dVar10) & 0xfff0000000000000);
        bVar2 = 1;
      }
      bVar5 = 1;
      if ((bVar3 & 1) == 0) {
        bVar5 = bVar2;
      }
      dVar9 = (double)(~-(ulong)(dVar9 <= dVar8) & (ulong)dVar8 |
                      (ulong)dVar9 & -(ulong)(dVar9 <= dVar8));
      dVar11 = (double)(~-(ulong)(dVar10 <= dVar11) & (ulong)dVar10 |
                       (ulong)dVar11 & -(ulong)(dVar10 <= dVar11));
    }
    else {
      dVar9 = INFINITY;
      dVar11 = -INFINITY;
      bVar5 = 0;
    }
    pEVar1 = local_f0;
    bVar3 = yi->m_hasNaN;
    if ((bool)bVar3 == true) {
      dVar9 = (double)((ulong)dVar9 & -(ulong)(dVar9 <= INFINITY) |
                      ~-(ulong)(dVar9 <= INFINITY) & 0x7ff0000000000000);
      dVar11 = (double)((ulong)dVar11 & -(ulong)(-INFINITY <= dVar11) |
                       ~-(ulong)(-INFINITY <= dVar11) & 0xfff0000000000000);
      bVar5 = 1;
    }
    dVar8 = yi->m_lo;
    if (dVar8 < yi->m_hi || dVar8 == yi->m_hi) {
      local_d8 = xi->m_hi;
      dVar10 = zi->m_lo;
      local_b8 = dVar9;
      dStack_b0 = dVar11;
      if (dVar10 < zi->m_hi || dVar10 == zi->m_hi) {
        local_f8 = (Interval *)dVar10;
        local_e8 = dVar8;
        dVar4 = deGetRoundingMode();
        local_c8 = (double)CONCAT44(local_c8._4_4_,dVar4);
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_f8,local_118,this,pEVar1);
        local_78 = (double)CONCAT71(local_78._1_7_,local_118[0]);
        local_88 = local_110;
        dStack_80 = dStack_108;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_f8,local_118,this,pEVar1);
        bVar2 = local_118[0];
        local_98 = local_110;
        dStack_90 = dStack_108;
        deSetRoundingMode(local_c8._0_4_);
        local_c8 = zi->m_hi;
        dVar4 = deGetRoundingMode();
        local_a8 = (double)CONCAT44(local_a8._4_4_,dVar4);
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_c8,local_118,this,local_f0);
        local_68 = (double)CONCAT71(local_68._1_7_,local_118[0]);
        local_58 = local_110;
        dStack_50 = dStack_108;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        local_f8 = __return_storage_ptr__;
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_c8,local_118,this,local_f0);
        bVar3 = local_118[0];
        local_e8 = local_110;
        dStack_e0 = dStack_108;
        deSetRoundingMode(local_a8._0_4_);
        dVar9 = (double)(~-(ulong)(local_88 <= local_98) & (ulong)local_98 |
                        (ulong)local_88 & -(ulong)(local_88 <= local_98));
        dVar11 = (double)(~-(ulong)(dStack_90 <= dStack_80) & (ulong)dStack_90 |
                         (ulong)dStack_80 & -(ulong)(dStack_90 <= dStack_80));
        if (((ulong)local_68 & 1) != 0) {
          bVar3 = 1;
        }
        if (((local_78._0_1_ | bVar2) & 1) != 0) {
          bVar3 = 1;
        }
        dVar8 = (double)(~-(ulong)(local_58 <= local_e8) & (ulong)local_e8 |
                        (ulong)local_58 & -(ulong)(local_58 <= local_e8));
        dVar10 = (double)(~-(ulong)(dStack_e0 <= dStack_50) & (ulong)dStack_e0 |
                         (ulong)dStack_50 & -(ulong)(dStack_e0 <= dStack_50));
        uVar6 = -(ulong)(dVar9 <= dVar8);
        uVar7 = -(ulong)(dVar10 <= dVar11);
        dVar9 = (double)(~uVar6 & (ulong)dVar8 | (ulong)dVar9 & uVar6);
        dVar11 = (double)(~uVar7 & (ulong)dVar10 | (ulong)dVar11 & uVar7);
        __return_storage_ptr__ = local_f8;
      }
      else {
        dVar9 = INFINITY;
        dVar11 = -INFINITY;
        bVar3 = 0;
      }
      bVar2 = zi->m_hasNaN;
      if ((bool)bVar2 == true) {
        dVar9 = (double)((ulong)dVar9 & -(ulong)(dVar9 <= INFINITY) |
                        ~-(ulong)(dVar9 <= INFINITY) & 0x7ff0000000000000);
        dVar11 = (double)((ulong)dVar11 & -(ulong)(-INFINITY <= dVar11) |
                         ~-(ulong)(-INFINITY <= dVar11) & 0xfff0000000000000);
        bVar3 = 1;
      }
      dVar8 = zi->m_lo;
      if (dVar8 < zi->m_hi || dVar8 == zi->m_hi) {
        local_e8 = yi->m_hi;
        local_f8 = (Interval *)dVar8;
        local_a8 = dVar9;
        dStack_a0 = dVar11;
        dVar4 = deGetRoundingMode();
        local_c8._0_4_ = dVar4;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_f8,local_118,this,local_f0);
        local_78 = (double)CONCAT71(local_78._1_7_,local_118[0]);
        local_88 = local_110;
        dStack_80 = dStack_108;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_f8,local_118,this,local_f0);
        local_98 = (double)CONCAT71(local_98._1_7_,local_118[0]);
        local_58 = local_110;
        dStack_50 = dStack_108;
        deSetRoundingMode(local_c8._0_4_);
        local_f8 = (Interval *)zi->m_hi;
        dVar4 = deGetRoundingMode();
        local_c8 = (double)CONCAT44(local_c8._4_4_,dVar4);
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_f8,local_118,this,local_f0);
        local_f9 = local_118[0];
        local_68 = local_110;
        dStack_60 = dStack_108;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_d8,local_e8,local_f8,local_118,this,local_f0);
        local_d8 = local_110;
        dStack_d0 = dStack_108;
        deSetRoundingMode(local_c8._0_4_);
        dVar9 = (double)(~-(ulong)(local_88 <= local_58) & (ulong)local_58 |
                        (ulong)local_88 & -(ulong)(local_88 <= local_58));
        dVar11 = (double)(~-(ulong)(dStack_50 <= dStack_80) & (ulong)dStack_50 |
                         (ulong)dStack_80 & -(ulong)(dStack_50 <= dStack_80));
        if ((local_f9 & 1) != 0) {
          local_118[0] = 1;
        }
        if (((local_78._0_1_ | local_98._0_1_) & 1) != 0) {
          local_118[0] = 1;
        }
        dVar8 = (double)(~-(ulong)(local_68 <= local_d8) & (ulong)local_d8 |
                        (ulong)local_68 & -(ulong)(local_68 <= local_d8));
        dVar10 = (double)(~-(ulong)(dStack_d0 <= dStack_60) & (ulong)dStack_d0 |
                         (ulong)dStack_60 & -(ulong)(dStack_d0 <= dStack_60));
        uVar6 = -(ulong)(dVar9 <= dVar8);
        uVar7 = -(ulong)(dVar10 <= dVar11);
        dVar8 = (double)(~uVar6 & (ulong)dVar8 | (ulong)dVar9 & uVar6);
        dVar10 = (double)(~uVar7 & (ulong)dVar10 | (ulong)dVar11 & uVar7);
        bVar2 = zi->m_hasNaN;
        dVar9 = local_a8;
        dVar11 = dStack_a0;
      }
      else {
        dVar8 = INFINITY;
        dVar10 = -INFINITY;
        local_118[0] = 0;
      }
      if ((bVar2 & 1) != 0) {
        dVar8 = (double)((ulong)dVar8 & -(ulong)(dVar8 <= INFINITY) |
                        ~-(ulong)(dVar8 <= INFINITY) & 0x7ff0000000000000);
        dVar10 = (double)((ulong)dVar10 & -(ulong)(-INFINITY <= dVar10) |
                         ~-(ulong)(-INFINITY <= dVar10) & 0xfff0000000000000);
        local_118[0] = 1;
      }
      bVar2 = 1;
      if ((bVar3 & 1) == 0) {
        bVar2 = local_118[0];
      }
      dVar8 = (double)(~-(ulong)(dVar9 <= dVar8) & (ulong)dVar8 |
                      (ulong)dVar9 & -(ulong)(dVar9 <= dVar8));
      dVar10 = (double)(~-(ulong)(dVar10 <= dVar11) & (ulong)dVar10 |
                       (ulong)dVar11 & -(ulong)(dVar10 <= dVar11));
      bVar3 = yi->m_hasNaN;
      dVar9 = local_b8;
      dVar11 = dStack_b0;
    }
    else {
      dVar8 = INFINITY;
      dVar10 = -INFINITY;
      bVar2 = 0;
    }
    if ((bVar3 & 1) != 0) {
      dVar8 = (double)((ulong)dVar8 & -(ulong)(dVar8 <= INFINITY) |
                      ~-(ulong)(dVar8 <= INFINITY) & 0x7ff0000000000000);
      dVar10 = (double)((ulong)dVar10 & -(ulong)(-INFINITY <= dVar10) |
                       ~-(ulong)(-INFINITY <= dVar10) & 0xfff0000000000000);
      bVar2 = 1;
    }
    local_48.m_hasNaN = (bool)1;
    if ((bVar5 & 1) == 0) {
      local_48.m_hasNaN = (bool)bVar2;
    }
    dVar9 = (double)(~-(ulong)(dVar9 <= dVar8) & (ulong)dVar8 |
                    (ulong)dVar9 & -(ulong)(dVar9 <= dVar8));
    dVar11 = (double)(~-(ulong)(dVar10 <= dVar11) & (ulong)dVar10 |
                     (ulong)dVar11 & -(ulong)(dVar10 <= dVar11));
    ctx = local_f0;
  }
  else {
    local_48.m_hasNaN = false;
  }
  local_48.m_lo = dVar9;
  local_48.m_hi = dVar11;
  if (xi->m_hasNaN == true) {
    if (dVar11 <= -INFINITY) {
      dVar11 = -INFINITY;
    }
    if (INFINITY <= dVar9) {
      dVar9 = INFINITY;
    }
    local_48.m_hasNaN = true;
    local_48.m_lo = dVar9;
    local_48.m_hi = dVar11;
  }
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_48);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext&	ctx,
										 const Interval&	xi,
										 const Interval&	yi,
										 const Interval&	zi) const
	{
		Interval reti;
		TCU_INTERVAL_APPLY_MONOTONE3(reti, x, xi, y, yi, z, zi, ret,
									 TCU_SET_INTERVAL(ret, point,
													  point = this->applyPoint(ctx, x, y, z)));
		return ctx.format.convert(reti);
	}